

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_loop(int argc,long argv,int unpack)

{
  int iVar1;
  __sighandler_t p_Var2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  undefined8 *puVar10;
  char *pcVar11;
  undefined8 *puVar12;
  ulong *msg;
  ulong uVar13;
  byte bVar14;
  int in_stack_00000068;
  int iStack0000000000000070;
  int iStack0000000000000074;
  int in_stack_00000078;
  int in_stack_00000080;
  undefined8 in_stack_00000088;
  int in_stack_00000090;
  char in_stack_0000049c;
  int in_stack_000006a0;
  int in_stack_000006a4;
  int in_stack_000006a8;
  int status;
  int islossless;
  char answer [30];
  char outfits [513];
  char infits [513];
  char valchar [78];
  char temp [513];
  undefined8 auStack_da8 [213];
  int local_700;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  char *local_6f0;
  int local_6e4;
  undefined8 local_6e0;
  char *local_6d8;
  long local_6d0;
  byte local_6c8 [28];
  char local_6ac [4];
  undefined1 local_6a8 [11];
  undefined1 uStack_69d;
  ulong local_498 [64];
  undefined1 local_298;
  char local_288 [72];
  undefined4 local_240;
  undefined2 local_23c;
  ulong local_238;
  undefined1 local_230;
  undefined1 local_38;
  
  bVar14 = 0;
  pcVar5 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz.#()+,-_@[]/^{}";
  pcVar11 = local_288;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)pcVar11 = *(undefined8 *)pcVar5;
    pcVar5 = pcVar5 + 8;
    pcVar11 = pcVar11 + 8;
  }
  local_23c = 0x7d;
  local_240 = 0x7b5e2f5d;
  local_6fc = 0;
  local_6f4 = argc;
  local_6d0 = argv;
  if (in_stack_000006a4 == 0x2a) {
    if (in_stack_000006a8 != 0) {
      local_6f0 = &stack0x0000049c;
      if ((in_stack_00000088._4_4_ != 0) && (in_stack_0000049c != '\0')) {
        outreport = (FILE *)fopen64(local_6f0,"w");
        fwrite(" Filename Extension BITPIX NAXIS1 NAXIS2 Size N_nulls Minval Maxval Mean Sigm Noise1 Noise2 Noise3 Noise5 T_whole T_rowbyrow "
               ,0x7d,1,(FILE *)outreport);
        fwrite("[Comp_ratio, Pack_cpu, Unpack_cpu, Lossless readtimes] (repeated for Rice, Hcompress, and GZIP)\n"
               ,0x60,1,(FILE *)outreport);
      }
      tempfilename[0] = '\0';
      tempfilename2[0] = '\0';
      tempfilename3[0] = '\0';
      p_Var2 = signal(2,(__sighandler_t)0x1);
      if (p_Var2 != (__sighandler_t)0x1) {
        signal(2,abort_fpack);
      }
      p_Var2 = signal(0xf,(__sighandler_t)0x1);
      if (p_Var2 != (__sighandler_t)0x1) {
        signal(0xf,abort_fpack);
      }
      p_Var2 = signal(1,(__sighandler_t)0x1);
      if (p_Var2 != (__sighandler_t)0x1) {
        signal(1,abort_fpack);
      }
      lVar7 = (long)in_stack_000006a0;
      if (in_stack_000006a0 < local_6f4) {
        local_6d8 = &stack0x00000094;
        local_6e0 = 0xfffffffd;
        local_700 = 0;
        local_6e4 = unpack;
        do {
          local_238 = local_238 & 0xffffffffffffff00;
          local_6a8[0] = 0;
          local_6f8 = 1;
          strncpy((char *)local_498,*(char **)(local_6d0 + lVar7 * 8),0x200);
          local_298 = 0;
          if (unpack == 0) {
            if (in_stack_00000068 != 0) goto LAB_00107c35;
            if (in_stack_00000088._4_4_ != 0) goto LAB_00107c3f;
            if (*local_6f0 != '\0') goto LAB_00107c1b;
            if ((char)local_498[0] == '-') {
              local_6a8[0] = 0x69;
              local_6a8[1] = 0x6e;
              local_6a8._2_5_ = 0x662e747570;
              local_6a8._7_4_ = 0x737469;
            }
            else {
              strcpy(local_6ac + 4,(char *)local_498);
            }
            sVar3 = strlen(local_6ac + 4);
            uVar9 = (uint)sVar3;
            if ((int)uVar9 < 3) {
LAB_00108210:
              if (3 < (int)uVar9) {
                iVar1 = strcmp(".bz2",local_6ac + (uVar9 & 0x7fffffff));
                iVar6 = -4;
                if (iVar1 == 0) goto LAB_0010823d;
              }
            }
            else {
              iVar1 = strcmp(".gz",local_6ac + (ulong)(uVar9 & 0x7fffffff) + 1);
              iVar6 = (int)local_6e0;
              if (iVar1 != 0) goto LAB_00108210;
LAB_0010823d:
              local_6ac[(ulong)(iVar6 + uVar9) + 4] = '\0';
            }
            sVar3 = strlen(local_6ac + 4);
            uVar9 = (uint)sVar3;
            if ((3 < (int)uVar9) &&
               (iVar1 = strcmp(".imh",local_6ac + (uVar9 & 0x7fffffff)), iVar1 == 0)) {
              local_6ac[(ulong)(uVar9 - 4) + 4] = '\0';
              sVar3 = strlen(local_6ac + 4);
              sVar4 = strlen(local_6ac + 4);
              if (sVar3 == 0x1fc) {
                local_6a8[sVar4 + 4] = 0;
              }
              else {
                *(undefined2 *)(local_6a8 + sVar4 + 4) = 0x73;
              }
              builtin_strncpy(local_6ac + sVar4 + 4,".fit",4);
              local_700 = 1;
            }
            if (iStack0000000000000070 == 0) {
              sVar3 = strlen(local_6ac + 4);
              builtin_strncpy(local_6ac + sVar3 + 4,".fz",4);
            }
          }
          else {
            if (((char)local_498[0] != '-') && (iVar1 = fp_access((char *)local_498), iVar1 != 0)) {
              sVar3 = strlen((char *)local_498);
              *(undefined4 *)((long)local_498 + sVar3) = 0x7a662e;
            }
            if (in_stack_00000068 == 0) {
              if (*local_6f0 == '\0') {
                pcVar5 = local_6ac + 4;
                if (*local_6d8 != '\0') {
                  strcpy(pcVar5,local_6d8);
                }
                if ((char)local_498[0] == '-') {
                  local_6a8[0] = 0x6f;
                  local_6a8[1] = 0x75;
                  local_6a8._2_5_ = 0x2e74757074;
                  local_6a8._7_4_ = 0x73746966;
                  uStack_69d = 0;
                }
                else {
                  strcat(pcVar5,(char *)local_498);
                }
                sVar3 = strlen(pcVar5);
                uVar9 = (uint)sVar3;
                if (((int)uVar9 < 3) ||
                   (iVar1 = strcmp(".gz",local_6ac + (ulong)(uVar9 & 0x7fffffff) + 1), iVar1 != 0))
                {
                  if (3 < (int)uVar9) {
                    iVar1 = strcmp(".bz2",local_6ac + (uVar9 & 0x7fffffff));
                    iVar6 = -4;
                    if (iVar1 == 0) goto LAB_0010815d;
                  }
                }
                else {
                  iVar6 = -3;
LAB_0010815d:
                  local_6ac[(ulong)(iVar6 + uVar9) + 4] = '\0';
                }
                sVar3 = strlen(local_6ac + 4);
                uVar9 = (uint)sVar3;
                if ((2 < (int)uVar9) &&
                   (iVar1 = strcmp(".fz",local_6ac + (ulong)(uVar9 & 0x7fffffff) + 1), iVar1 == 0))
                {
                  local_6ac[(ulong)(uVar9 - 3) + 4] = '\0';
                }
              }
              else {
LAB_00107c1b:
                strcpy(local_6ac + 4,local_6f0);
              }
            }
            else {
LAB_00107c35:
              local_6a8[0] = 0x2d;
              local_6a8[1] = 0;
            }
          }
LAB_00107c3f:
          strncpy((char *)&local_238,local_6ac + 4,0x200);
          local_38 = 0;
          if (((char)local_498[0] != '-') &&
             (iVar1 = strcmp((char *)local_498,local_6ac + 4), iVar1 == 0)) {
            if (iStack0000000000000070 == 0) {
              pcVar5 = "\nError: must use -F flag to clobber input file.\n";
              goto LAB_0010847b;
            }
            fp_tmpnam("Tmp1",(char *)local_498,local_6ac + 4);
            strcpy(tempfilename,local_6ac + 4);
          }
          if ((in_stack_00000090 != 0) && (in_stack_00000068 == 0)) {
            printf("%s ",local_498);
          }
          if (in_stack_00000088._4_4_ == 0) {
            if (unpack != 0) {
              if (in_stack_00000068 != 0) {
                puVar10 = (undefined8 *)&stack0x00000008;
                puVar12 = auStack_da8;
                for (lVar8 = 0xd5; lVar8 != 0; lVar8 = lVar8 + -1) {
                  *puVar12 = *puVar10;
                  puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
                  puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
                }
                fp_unpack(local_498,local_6ac + 4);
                goto LAB_00107eeb;
              }
              fp_tmpnam("Tmp2",local_6ac + 4,tempfilename2);
              puVar10 = (undefined8 *)&stack0x00000008;
              puVar12 = auStack_da8;
              for (lVar8 = 0xd5; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar12 = *puVar10;
                puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
                puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
              }
              fp_unpack(local_498,tempfilename2);
              iVar1 = rename(tempfilename2,local_6ac + 4);
              if (iVar1 == 0) {
                tempfilename2[0] = '\0';
                goto LAB_00107eeb;
              }
              fp_msg("Failed to rename temporary file name:\n  ");
              fp_msg(tempfilename2);
              fp_msg(" -> ");
              msg = (ulong *)(local_6ac + 4);
LAB_00108506:
              fp_msg((char *)msg);
              pcVar5 = "\n";
              goto LAB_0010847b;
            }
            puVar10 = (undefined8 *)&stack0x00000008;
            puVar12 = auStack_da8;
            for (lVar8 = 0xd5; lVar8 != 0; lVar8 = lVar8 + -1) {
              *puVar12 = *puVar10;
              puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
              puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
            }
            fp_pack(local_498,local_6ac + 4,&local_6f8);
LAB_00107eeb:
            if (in_stack_00000068 == 0) {
              iVar1 = strcmp((char *)local_498,(char *)&local_238);
              if (iStack0000000000000070 == 0 || iVar1 != 0) {
                if (iStack0000000000000070 != 0 || iStack0000000000000074 != 0) {
                  if (in_stack_00000078 == 0 && local_6f8 == 0) {
                    printf("%s","\nFile ");
                    printf("%s",local_498);
                    puts("\nwas compressed with a LOSSY method.  ");
                    printf("%s","Delete the original file? (Y/N) ");
                    fgets((char *)local_6c8,0x1d,_stdin);
                    if ((local_6c8[0] & 0xdf) != 0x59) {
                      puts("\noriginal file NOT deleted!");
                      goto LAB_001082f4;
                    }
                  }
                  if (local_700 == 0) {
                    iVar1 = remove((char *)local_498);
                    if (iVar1 != 0) {
                      pcVar5 = "\nError deleting input file ";
                      goto LAB_001084f9;
                    }
                  }
                  else {
                    iVar1 = fits_delete_iraf_file((char *)local_498,&local_6fc);
                    if (iVar1 != 0) goto LAB_001084f2;
                  }
                }
              }
              else {
                if (in_stack_00000078 == 0 && local_6f8 == 0) {
                  printf("%s","\nFile ");
                  printf("%s",local_498);
                  puts("\nwas compressed with a LOSSY method.  Overwrite the");
                  printf("%s","original file with the compressed version? (Y/N) ");
                  fgets((char *)local_6c8,0x1d,_stdin);
                  if ((local_6c8[0] & 0xdf) != 0x59) {
                    puts("\noriginal file NOT overwritten!");
                    remove(local_6ac + 4);
                    goto LAB_001083ee;
                  }
                }
                if ((local_700 != 0) &&
                   (iVar1 = fits_delete_iraf_file((char *)local_498,&local_6fc), iVar1 != 0)) {
LAB_001084f2:
                  pcVar5 = "\nError deleting IRAF .imh and .pix files.\n";
LAB_001084f9:
                  fp_msg(pcVar5);
                  msg = local_498;
                  goto LAB_00108506;
                }
                iVar1 = rename(local_6ac + 4,(char *)&local_238);
                if (iVar1 != 0) {
                  fp_msg("\nError renaming tmp file to ");
                  msg = &local_238;
                  goto LAB_00108506;
                }
                tempfilename[0] = '\0';
                strcpy(local_6ac + 4,(char *)&local_238);
                unpack = local_6e4;
              }
LAB_001082f4:
              if (in_stack_00000080 != 0) {
                local_238 = 0x20312d2070697a67;
                local_230 = 0;
                sVar3 = strlen(local_6ac + 4);
                uVar9 = (uint)sVar3;
                if (0x1f8 < (int)uVar9) {
                  pcVar5 = "\nError: Output file name is too long.\n";
                  goto LAB_0010847b;
                }
                if (0 < (int)uVar9) {
                  uVar13 = 0;
                  do {
                    pcVar5 = strchr(local_288,(int)local_6ac[uVar13 + 4]);
                    if (pcVar5 == (char *)0x0) {
                      pcVar5 = "\n Error: Invalid characters in output file name.\n";
                      goto LAB_0010847b;
                    }
                    uVar13 = uVar13 + 1;
                  } while ((uVar9 & 0x7fffffff) != uVar13);
                }
                strcat((char *)&local_238,local_6ac + 4);
                system((char *)&local_238);
                sVar3 = strlen(local_6ac + 4);
                builtin_strncpy(local_6ac + sVar3 + 4,".gz",4);
              }
              local_700 = 0;
              if ((in_stack_00000090 != 0) && (in_stack_00000068 == 0)) {
                local_700 = 0;
                printf("-> %s\n",local_6ac + 4);
              }
            }
          }
          else {
            fp_tmpnam("Tmpfile1","",tempfilename);
            fp_tmpnam("Tmpfile2","",tempfilename2);
            puVar10 = (undefined8 *)&stack0x00000008;
            puVar12 = auStack_da8;
            for (lVar8 = 0xd5; lVar8 != 0; lVar8 = lVar8 + -1) {
              *puVar12 = *puVar10;
              puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
              puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
            }
            fp_test(local_498,tempfilename,tempfilename2);
            remove(tempfilename);
            tempfilename[0] = '\0';
            remove(tempfilename2);
            tempfilename2[0] = '\0';
          }
LAB_001083ee:
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 != local_6f4);
      }
      if ((in_stack_00000088._4_4_ != 0) && (in_stack_0000049c != '\0')) {
        fclose((FILE *)outreport);
      }
      return 0;
    }
    pcVar5 = "Error: internal preflight error\n";
  }
  else {
    pcVar5 = "Error: internal initialization error\n";
  }
LAB_0010847b:
  fp_msg(pcVar5);
  exit(-1);
}

Assistant:

int fp_loop (int argc, char *argv[], int unpack, fpstate fpvar)
{
	char	infits[SZ_STR], outfits[SZ_STR];
	char	temp[SZ_STR], answer[30];
        char    valchar[]="0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz.#()+,-_@[]/^{}";
	int	ichar=0, outlen=0, iarg, islossless, namelen, iraf_infile = 0, status = 0, ifail;
        
	if (fpvar.initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	} else if (! fpvar.preflight_checked) {
	    fp_msg ("Error: internal preflight error\n"); exit (-1);
	}

	if (fpvar.test_all && fpvar.outfile[0]) {
	    outreport = fopen(fpvar.outfile, "w");
		fprintf(outreport," Filename Extension BITPIX NAXIS1 NAXIS2 Size N_nulls Minval Maxval Mean Sigm Noise1 Noise2 Noise3 Noise5 T_whole T_rowbyrow ");
		fprintf(outreport,"[Comp_ratio, Pack_cpu, Unpack_cpu, Lossless readtimes] (repeated for Rice, Hcompress, and GZIP)\n");
	}


	tempfilename[0] = '\0';
	tempfilename2[0] = '\0';
	tempfilename3[0] = '\0';

/* set up signal handler to delete temporary file on abort */	    
#ifdef SIGINT
    if (signal(SIGINT, SIG_IGN) != SIG_IGN) {
	(void) signal(SIGINT,  abort_fpack); 
    }
#endif

#ifdef SIGTERM
    if (signal(SIGTERM, SIG_IGN) != SIG_IGN) {
	(void) signal(SIGTERM,  abort_fpack); 
    }
#endif

#ifdef SIGHUP
    if (signal(SIGHUP, SIG_IGN) != SIG_IGN) {
	(void) signal(SIGHUP,  abort_fpack);
    }
#endif

	for (iarg=fpvar.firstfile; iarg < argc; iarg++) {

          temp[0] = '\0';
	  outfits[0] = '\0';
          islossless = 1;

	  strncpy (infits, argv[iarg], SZ_STR - 1);
          infits[SZ_STR-1]=0;

          if (unpack) {
	  	/* ********** This section applies to funpack ************ */

	      /* find input file */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	         if (fp_access (infits) != 0) {  /* if not, then */
		    strcat(infits, ".fz");       /* a .fz version must exsit */
                    /* fp_preflight already checked for enough size to add '.fz' */
	         }
	      }

	      if (fpvar.to_stdout) {
		strcpy(outfits, "-");

              } else if (fpvar.outfile[0]) {  /* user specified output file name */
	          strcpy(outfits, fpvar.outfile);

	      } else {
	          /* construct output file name */
	          if (fpvar.prefix[0]) {
                      /* fp_preflight already checked this */
	              strcpy(outfits,fpvar.prefix);
	          }

	          /* construct output file name */
	          if (infits[0] == '-') {
	            strcpy(outfits, "output.fits");
	          } else {
	            strcat(outfits, infits);
	          }

	          /* remove .gz suffix, if present (output is not gzipped) */
                  namelen = strlen(outfits);
	          if (namelen >= 3 &&  !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	          }
                  else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                            outfits[namelen - 4] = '\0';
                  }

	          /* check for .fz suffix that is sometimes required */
	          /* and remove it if present */
                  namelen = strlen(outfits);
	          if (namelen >= 3 && !strcmp(".fz", outfits + namelen - 3) ) { /* suffix is present */
                        outfits[namelen - 3] = '\0';
	          }
	      }

	  } else {
	  	/* ********** This section applies to fpack ************ */

	      if (fpvar.to_stdout) {
		strcpy(outfits, "-");
	      } else if (! fpvar.test_all) {

                  if (fpvar.outfile[0]) { /* user specified output file name */
                     strcpy(outfits, fpvar.outfile);
                  }
                  else {
	             /* construct output file name */
	             if (infits[0] == '-') {
	               strcpy(outfits, "input.fits");
	             } else {
	               strcpy(outfits, infits);
	             }
	             /* Remove .gz suffix, if present (output is not gzipped). 
                        Do the same for .bz2 */
                     namelen = strlen(outfits);
	             if (namelen >= 3 && !strcmp(".gz", outfits + namelen - 3) ) {
                           outfits[namelen - 3] = '\0';
	             }
                     else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                           outfits[namelen - 4] = '\0';
                     }

	             /* remove .imh suffix (IRAF format image), and replace with .fits */
                     namelen = strlen(outfits);
	             if (namelen >= 4 && !strcmp(".imh", outfits + namelen - 4) ) {
                           outfits[namelen - 4] = '\0';
                           if (strlen(outfits) == SZ_STR-5)
                              strcat(outfits, ".fit");
                           else
                              strcat(outfits, ".fits");
                           iraf_infile = 1;  /* this is an IRAF format input file */
			              /* change the output name to "NAME.fits.fz" */
	             }

	             /* If not clobbering the input file, add .fz suffix to output name */
	             if (! fpvar.clobber)
		           strcat(outfits, ".fz");
	          }
	      }
	  }

          strncpy(temp, outfits, SZ_STR-1);
          temp[SZ_STR-1]=0;

	  if (infits[0] != '-') {  /* if not reading from stdin stream */
             if (!strcmp(infits, outfits) ) {  /* are input and output names the same? */

                /* clobber the input file with the output file with the same name */
                if (! fpvar.clobber) {
                    fp_msg ("\nError: must use -F flag to clobber input file.\n");
		    exit (-1);
		} 

                /* create temporary file name in the output directory (same as input directory)*/
		fp_tmpnam("Tmp1", infits, outfits);
		
                strcpy(tempfilename, outfits);  /* store temp file name, in case of abort */
	      }
	    }


            /* *************** now do the real work ********************* */
	    
	    if (fpvar.verbose && ! fpvar.to_stdout)
		printf("%s ", infits);
		
	    if (fpvar.test_all) {   /* compare all the algorithms */

                /* create 2 temporary file names, in the CWD */
		fp_tmpnam("Tmpfile1", "", tempfilename);
		fp_tmpnam("Tmpfile2", "", tempfilename2);

		fp_test (infits, tempfilename, tempfilename2, fpvar);

		remove(tempfilename);
                tempfilename[0] = '\0';   /* clear the temp file name */
		remove(tempfilename2);
                tempfilename2[0] = '\0';
                continue;

	    } else if (unpack) {
		if (fpvar.to_stdout) {
			/* unpack the input file to the stdout stream */
			fp_unpack (infits, outfits, fpvar);
		} else {
			/* unpack to temporary file, so other tasks can't open it until it is renamed */

			/* create  temporary file name, in the output directory */
			fp_tmpnam("Tmp2", outfits, tempfilename2);

			/* unpack the input file to the temporary file */
			fp_unpack (infits, tempfilename2, fpvar);

			/* rename the temporary file to it's real name */
			ifail = rename(tempfilename2, outfits);
			if (ifail) {
			    fp_msg("Failed to rename temporary file name:\n  ");
			    fp_msg(tempfilename2);
			    fp_msg(" -> ");
			    fp_msg(outfits);
			    fp_msg("\n");
			    exit (-1);
			} else {
			    tempfilename2[0] = '\0';  /* clear temporary file name */
			}
		}
	    }  else {
		fp_pack (infits, outfits, fpvar, &islossless);
	    }

	    if (fpvar.to_stdout) {
		continue;
	    }

            /* ********** clobber and/or delete files, if needed ************** */

            if (!strcmp(infits, temp) && fpvar.clobber ) {  

		if (!islossless && ! fpvar.do_not_prompt) {
		    fp_msg ("\nFile ");
		    fp_msg (infits); 
		    fp_msg ("\nwas compressed with a LOSSY method.  Overwrite the\n");
		    fp_msg ("original file with the compressed version? (Y/N) ");
		    fgets(answer, 29, stdin);
		    if (answer[0] != 'Y' && answer[0] != 'y') {
		        fp_msg ("\noriginal file NOT overwritten!\n");
			remove(outfits);
                        continue;
		    }
		}

		if (iraf_infile) {  /* special case of deleting an IRAF format header and pixel file */
		   if (fits_delete_iraf_file(infits, &status)) {
		        fp_msg("\nError deleting IRAF .imh and .pix files.\n");
			fp_msg(infits); fp_msg ("\n"); exit (-1);
		    }
		}
				
#if defined(unix) || defined(__unix__)  || defined(__unix)
	        /* rename clobbers input on Unix platforms */
		if (rename (outfits, temp) != 0) {
		        fp_msg ("\nError renaming tmp file to ");
		        fp_msg (temp); fp_msg ("\n"); exit (-1);
		}
#else
	        /* rename DOES NOT clobber existing files on Windows platforms */
                /* so explicitly remove any existing file before renaming the file */
                remove(temp);
		if (rename (outfits, temp) != 0) {
		        fp_msg ("\nError renaming tmp file to ");
		        fp_msg (temp); fp_msg ("\n"); exit (-1);
		}
#endif

		tempfilename[0] = '\0';  /* clear temporary file name */
                strcpy(outfits, temp);

	    } else if (fpvar.clobber || fpvar.delete_input) {      /* delete the input file */
	         if (!islossless && !fpvar.do_not_prompt) {  /* user did not turn off delete prompt */
		    fp_msg ("\nFile ");
		    fp_msg (infits); 
		    fp_msg ("\nwas compressed with a LOSSY method.  \n");
		    fp_msg ("Delete the original file? (Y/N) ");
		    fgets(answer, 29, stdin);
		    if (answer[0] != 'Y' && answer[0] != 'y') {  /* user abort */
		        fp_msg ("\noriginal file NOT deleted!\n");
		    } else {
			if (iraf_infile) {  /* special case of deleting an IRAF format header and pixel file */
		   	    if (fits_delete_iraf_file(infits, &status)) {
		        	fp_msg("\nError deleting IRAF .imh and .pix files.\n");
				fp_msg(infits); fp_msg ("\n"); exit (-1);
			    }
		        }  else if (remove(infits) != 0) {  /* normal case of deleting input FITS file */
		            fp_msg ("\nError deleting input file ");
		            fp_msg (infits); fp_msg ("\n"); exit (-1);
		        }
		    }
		  } else {   /* user said don't prompt, so just delete the input file */
			if (iraf_infile) {  /* special case of deleting an IRAF format header and pixel file */
		   	    if (fits_delete_iraf_file(infits, &status)) {
		        	fp_msg("\nError deleting IRAF .imh and .pix files.\n");
				fp_msg(infits); fp_msg ("\n"); exit (-1);
			    }
		        }  else if (remove(infits) != 0) {  /* normal case of deleting input FITS file */
		            fp_msg ("\nError deleting input file ");
		            fp_msg (infits); fp_msg ("\n"); exit (-1);
		        }
		  }
	    }
            iraf_infile = 0; 

	    if (fpvar.do_gzip_file) {       /* gzip the output file */
		strcpy(temp, "gzip -1 ");
                outlen = strlen(outfits);
                if (outlen + 8 > SZ_STR-1)
                {
                   fp_msg("\nError: Output file name is too long.\n");
                   exit(-1);
                }
                for (ichar=0; ichar < outlen; ++ichar)
                {
                   if (!strchr(valchar, outfits[ichar]))
                   {
                      fp_msg("\n Error: Invalid characters in output file name.\n");
                      exit(-1);
                   }
                }                
		strcat(temp,outfits);
                system(temp);
	        strcat(outfits, ".gz");    /* only possibible with funpack */
	    }

	    if (fpvar.verbose && ! fpvar.to_stdout)
		printf("-> %s\n", outfits);

	}

	if (fpvar.test_all && fpvar.outfile[0])
	    fclose(outreport);
	return(0);
}